

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUser
          (DefUseManager *this,Instruction *def,function<bool_(spvtools::opt::Instruction_*)> *f)

{
  bool bVar1;
  uint32_t id;
  Instruction *pIVar2;
  const_iterator cVar3;
  bool bVar4;
  Instruction *local_38;
  
  if (def != (Instruction *)0x0) {
    if (def->has_result_id_ == true) {
      id = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
      pIVar2 = GetDef(this,id);
      if (pIVar2 != def) goto LAB_00562edb;
    }
    bVar4 = true;
    if (def->has_result_id_ != false) {
      cVar3 = UsersBegin(this,def);
      while( true ) {
        if ((_Rb_tree_header *)cVar3._M_node ==
            &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header) {
          bVar4 = false;
        }
        else {
          bVar4 = *(Instruction **)(cVar3._M_node + 1) == def;
        }
        if (bVar4 == false) break;
        local_38 = (Instruction *)cVar3._M_node[1]._M_parent;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar1 = (*f->_M_invoker)((_Any_data *)f,&local_38);
        if (!bVar1) break;
        cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    return bVar4;
  }
LAB_00562edb:
  __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                ,0x76,
                "bool spvtools::opt::analysis::DefUseManager::WhileEachUser(const Instruction *, const std::function<bool (Instruction *)> &) const"
               );
}

Assistant:

bool DefUseManager::WhileEachUser(
    const Instruction* def, const std::function<bool(Instruction*)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    if (!f(iter->user)) return false;
  }
  return true;
}